

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

MatrixOrder
deqp::gles31::Functional::anon_unknown_0::getMatrixOrderFromPath
          (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           *path)

{
  MatrixOrder MVar1;
  pointer pVVar2;
  Type *pTVar3;
  long lVar4;
  MatrixOrder MVar5;
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = &pVVar2->m_type;
  lVar4 = 0;
  MVar5 = MATRIXORDER_LAST;
  do {
    if ((int)((ulong)((long)(path->
                            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) >> 4) <=
        lVar4) {
      return MVar5;
    }
    if (*pTVar3 - TYPE_INTERFACEBLOCK < 2) {
      MVar1 = (((((VariablePathComponent *)(pTVar3 + -2))->m_data).block)->layout).matrixOrder;
      if (MVar1 != MATRIXORDER_LAST) {
        MVar5 = MVar1;
      }
    }
    else if (*pTVar3 != TYPE_TYPE) {
      return MATRIXORDER_LAST;
    }
    lVar4 = lVar4 + 1;
    pTVar3 = pTVar3 + 4;
  } while( true );
}

Assistant:

static glu::MatrixOrder getMatrixOrderFromPath (const std::vector<VariablePathComponent>& path)
{
	glu::MatrixOrder order = glu::MATRIXORDER_LAST;

	// inherit majority
	for (int pathNdx = 0; pathNdx < (int)path.size(); ++pathNdx)
	{
		glu::MatrixOrder matOrder;

		if (path[pathNdx].isInterfaceBlock())
			matOrder = path[pathNdx].getInterfaceBlock()->layout.matrixOrder;
		else if (path[pathNdx].isDeclaration())
			matOrder = path[pathNdx].getDeclaration()->layout.matrixOrder;
		else if (path[pathNdx].isVariableType())
			matOrder = glu::MATRIXORDER_LAST;
		else
		{
			DE_ASSERT(false);
			return glu::MATRIXORDER_LAST;
		}

		if (matOrder != glu::MATRIXORDER_LAST)
			order = matOrder;
	}

	return order;
}